

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

SyntaxTree * __thiscall DL::Parser::gr_tr_unit(Parser *this)

{
  iterator __position;
  bool bVar1;
  vector<DL::StatementNode*,std::allocator<DL::StatementNode*>> *this_00;
  StatementNode *local_88;
  Token local_80;
  Token local_58;
  
  this_00 = (vector<DL::StatementNode*,std::allocator<DL::StatementNode*>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  bVar1 = lookahead(this,T_OpenParanthese);
  if (bVar1) {
    do {
      match(&local_58,this,T_OpenParanthese);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.Value._M_dataplus._M_p != &local_58.Value.field_2) {
        operator_delete(local_58.Value._M_dataplus._M_p,
                        local_58.Value.field_2._M_allocated_capacity + 1);
      }
      local_88 = gr_statement(this);
      __position._M_current = *(StatementNode ***)(this_00 + 8);
      if (__position._M_current == *(StatementNode ***)(this_00 + 0x10)) {
        std::vector<DL::StatementNode*,std::allocator<DL::StatementNode*>>::
        _M_realloc_insert<DL::StatementNode*>(this_00,__position,&local_88);
      }
      else {
        *__position._M_current = local_88;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      match(&local_80,this,T_CloseParanthese);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.Value._M_dataplus._M_p != &local_80.Value.field_2) {
        operator_delete(local_80.Value._M_dataplus._M_p,
                        local_80.Value.field_2._M_allocated_capacity + 1);
      }
      bVar1 = lookahead(this,T_OpenParanthese);
    } while (bVar1);
  }
  return (SyntaxTree *)this_00;
}

Assistant:

SyntaxTree* Parser::gr_tr_unit()
{
	SyntaxTree* unit = new SyntaxTree;
	while (lookahead(T_OpenParanthese)) {
		match(T_OpenParanthese);
		unit->Nodes.push_back(gr_statement());
		match(T_CloseParanthese);
	};
	return unit;
}